

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<2048,Blob<224>>
               (hashfunc<Blob<224>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  reference pvVar3;
  size_type sVar4;
  byte in_CL;
  uint in_EDX;
  char *pcVar5;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  keytype k;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  undefined4 in_stack_fffffffffffffec8;
  byte bVar6;
  undefined4 in_stack_fffffffffffffecc;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_fffffffffffffed0;
  Blob<2048> *in_stack_fffffffffffffed8;
  uint8_t in_stack_fffffffffffffee7;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  pfHash in_stack_fffffffffffffef0;
  uint8_t in_stack_ffffffffffffffab;
  uint8_t in_stack_ffffffffffffffac;
  uint8_t in_stack_ffffffffffffffad;
  uint8_t in_stack_ffffffffffffffae;
  uint8_t in_stack_ffffffffffffffaf;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffffb0;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar5 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar5 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x800,pcVar5,(ulong)in_ESI);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x188a6f);
  Blob<2048>::Blob((Blob<2048> *)&stack0xfffffffffffffed8);
  memset(&stack0xfffffffffffffed8,0,0x100);
  if ((local_d & 1) != 0) {
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::resize
              (in_stack_fffffffffffffed0,
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar3 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[](&local_28,0);
    (*p_Var2)(&stack0xfffffffffffffed8,0x100,0,pvVar3);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<2048>,Blob<224>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
             (bool)in_stack_fffffffffffffee7,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  sVar4 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(&local_28);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar6 = 1;
  bVar1 = TestHashList<Blob<224>>
                    (in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf,
                     (bool)in_stack_ffffffffffffffae,(bool)in_stack_ffffffffffffffad,
                     (bool)in_stack_ffffffffffffffac,(bool)in_stack_ffffffffffffffab);
  bVar6 = bVar1 & bVar6;
  printf("\n");
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar6 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}